

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

void Llb_Nonlin4VerifyScores(Llb_Mgr_t_conflict *p)

{
  Llb_Prt_t *pLVar1;
  Llb_Var_t *pLVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = p->iPartFree;
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      pLVar1 = p->pParts[lVar7];
      if (pLVar1 != (Llb_Prt_t *)0x0) {
        iVar5 = pLVar1->nSize;
        iVar3 = Cudd_DagSize(pLVar1->bFunc);
        if (iVar5 != iVar3) {
          __assert_fail("pPart->nSize == Cudd_DagSize(pPart->bFunc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Image.c"
                        ,0x29f,"void Llb_Nonlin4VerifyScores(Llb_Mgr_t *)");
        }
        iVar5 = p->iPartFree;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  if (0 < (long)p->nVars) {
    lVar7 = 0;
    do {
      pLVar2 = p->pVars[lVar7];
      if (pLVar2 != (Llb_Var_t *)0x0) {
        lVar4 = (long)pLVar2->vParts->nSize;
        if (lVar4 < 1) {
          iVar5 = 0;
        }
        else {
          lVar6 = 0;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + p->pParts[pLVar2->vParts->pArray[lVar6]]->nSize;
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
        if (iVar5 != pLVar2->nScore) {
          __assert_fail("nScore == pVar->nScore",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Image.c"
                        ,0x2a5,"void Llb_Nonlin4VerifyScores(Llb_Mgr_t *)");
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != p->nVars);
  }
  return;
}

Assistant:

void Llb_Nonlin4VerifyScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k, nScore;
    Llb_MgrForEachPart( p, pPart, i )
        assert( pPart->nSize == Cudd_DagSize(pPart->bFunc) );
    Llb_MgrForEachVar( p, pVar, i )
    {
        nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            nScore += pPart->nSize;
        assert( nScore == pVar->nScore );
    }
}